

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::HeapString::~HeapString(HeapString *this)

{
  ~HeapString(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

HeapString(const UString &value) : HeapEntity(STRING), value(value) {}